

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_scrape_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  type_conflict tVar1;
  uint uVar2;
  type_conflict tVar3;
  uint uVar4;
  uint uVar5;
  error_code_enum e;
  shared_ptr<libtorrent::aux::request_callback> cb;
  element_type local_60 [2];
  span<const_char> buf_local;
  error_code local_40;
  
  buf_local.m_len = buf.m_len;
  buf_local.m_ptr = buf.m_ptr;
  timeout_handler::restart_read_timeout((timeout_handler *)this);
  uVar2 = read_impl<int,char_const>(&buf_local);
  tVar3 = read_impl<unsigned_int,char_const>(&buf_local);
  tVar1 = this->m_transaction_id;
  if (tVar3 == tVar1) {
    if ((char)uVar2 == '\x02') {
      if (0xb < buf_local.m_len) {
        uVar2 = read_impl<int,char_const>(&buf_local);
        uVar4 = read_impl<int,char_const>(&buf_local);
        uVar5 = read_impl<int,char_const>(&buf_local);
        tracker_connection::requester((tracker_connection *)&cb);
        if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_request_callback[3])
                    (cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&(this->super_tracker_connection).m_req,(ulong)uVar2,(ulong)uVar5,
                     (ulong)uVar4,0xffffffffffffffff);
        }
        (*(this->super_tracker_connection).super_timeout_handler._vptr_timeout_handler[4])(this);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cb.
                    super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        goto LAB_0032edf8;
      }
      e = invalid_tracker_response_length;
    }
    else {
      if ((uVar2 & 0xff) == 3) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_40,tracker_failure,(type *)0x0);
        cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = local_60;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&cb,buf_local.m_ptr,buf_local.m_ptr + buf_local.m_len);
        fail(this,&local_40,bittorrent,
             (char *)cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(seconds32)0x0,(seconds32)0x1e);
        ::std::__cxx11::string::~string((string *)&cb);
        goto LAB_0032edf8;
      }
      e = invalid_tracker_action;
    }
  }
  else {
    e = invalid_tracker_transaction_id;
  }
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            ((error_code *)&cb,e,(type *)0x0);
  fail(this,(error_code *)&cb,bittorrent,"",(seconds32)0x0,(seconds32)0x1e);
LAB_0032edf8:
  return tVar3 == tVar1;
}

Assistant:

bool udp_tracker_connection::on_scrape_response(span<char const> buf)
	{
		restart_read_timeout();
		auto const action = static_cast<action_t>(aux::read_int32(buf));
		std::uint32_t const transaction = aux::read_uint32(buf);

		if (transaction != m_transaction_id)
		{
			fail(error_code(errors::invalid_tracker_transaction_id), operation_t::bittorrent);
			return false;
		}

		if (action == action_t::error)
		{
			fail(error_code(errors::tracker_failure), operation_t::bittorrent
				, std::string(buf.data(), static_cast<std::size_t>(buf.size())).c_str());
			return true;
		}

		if (action != action_t::scrape)
		{
			fail(error_code(errors::invalid_tracker_action), operation_t::bittorrent);
			return true;
		}

		if (buf.size() < 12)
		{
			fail(error_code(errors::invalid_tracker_response_length), operation_t::bittorrent);
			return true;
		}

		int const complete = aux::read_int32(buf);
		int const downloaded = aux::read_int32(buf);
		int const incomplete = aux::read_int32(buf);

		std::shared_ptr<request_callback> cb = requester();
		if (!cb)
		{
			close();
			return true;
		}

		cb->tracker_scrape_response(tracker_req()
			, complete, incomplete, downloaded, -1);

		close();
		return true;
	}